

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m2v_U_invmult_inplace_p(m2v *LU,int rank,m2v *X_inout,int *placements)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int r1;
  undefined8 uStack_38;
  
  uVar1 = (ulong)(uint)rank;
  while (uVar3 = uVar1, 0 < (int)uVar3) {
    uVar1 = uVar3 - 1;
    uStack_38 = uVar1 << 0x20;
    if (placements != (int *)0x0) {
      uStack_38 = (ulong)(uint)placements[uVar1 & 0xffffffff] << 0x20;
    }
    for (; iVar2 = (int)uVar3, iVar2 < LU->n_col; uVar3 = uVar3 + 1) {
      r1 = iVar2;
      if (placements != (int *)0x0) {
        r1 = placements[uVar3];
      }
      iVar2 = m2v_get_el(LU,(int)uVar1,iVar2);
      m2v_multadd_row(X_inout,r1,iVar2,X_inout,uStack_38._4_4_);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_U_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply U^(-1) */
	for (int i = rank - 1; i >= 0; --i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = i + 1; j < LU->n_col; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
			  MV_GEN_N(_get_el)(LU, i, j),
			  X_inout, pi);
		}
		MV_GEN_N(_mult_row)(X_inout, pi,
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}